

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O0

void __thiscall
Eigen::DenseStorage<float,_-1,_-1,_3,_1>::resize
          (DenseStorage<float,__1,__1,_3,_1> *this,DenseIndex size,DenseIndex nbRows,
          DenseIndex param_3)

{
  float *pfVar1;
  DenseIndex param_3_local;
  DenseIndex nbRows_local;
  DenseIndex size_local;
  DenseStorage<float,__1,__1,_3,_1> *this_local;
  
  if (size != this->m_rows * 3) {
    internal::conditional_aligned_delete_auto<float,true>(this->m_data,this->m_rows * 3);
    if (size == 0) {
      this->m_data = (float *)0x0;
    }
    else {
      pfVar1 = internal::conditional_aligned_new_auto<float,true>(size);
      this->m_data = pfVar1;
    }
  }
  this->m_rows = nbRows;
  return;
}

Assistant:

EIGEN_STRONG_INLINE void resize(DenseIndex size, DenseIndex nbRows, DenseIndex)
    {
      if(size != m_rows*_Cols)
      {
        internal::conditional_aligned_delete_auto<T,(_Options&DontAlign)==0>(m_data, _Cols*m_rows);
        if (size)
          m_data = internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size);
        else
          m_data = 0;
        EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN
      }
      m_rows = nbRows;
    }